

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMagic.cpp
# Opt level: O3

void anon_unknown.dwarf_1cd405::testFile2(char *fileName,bool exists,bool exrFile,bool tiledFile)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  bool tiled;
  StdIFStream is;
  bool local_69;
  StdIFStream local_68 [56];
  
  if (fileName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1f3f58);
  }
  else {
    sVar3 = strlen(fileName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::flush();
  cVar2 = Imf_3_2::isOpenExrFile(fileName,&local_69);
  bVar1 = local_69;
  if (((bool)cVar2 != exrFile) || (local_69 != tiledFile)) {
    __assert_fail("exr == exrFile && tiled == tiledFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x37,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  cVar2 = Imf_3_2::isOpenExrFile(fileName);
  if ((bool)cVar2 != exrFile) {
    __assert_fail("exr == exrFile",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                  ,0x3a,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
  }
  local_69 = (bool)Imf_3_2::isTiledOpenExrFile(fileName);
  if (local_69 == tiledFile) {
    if (exists) {
      Imf_3_2::StdIFStream::StdIFStream(local_68,fileName);
      cVar2 = Imf_3_2::isOpenExrFile((IStream *)local_68,&local_69);
      if (((bool)cVar2 != exrFile) || (local_69 != bVar1)) {
        __assert_fail("exr == exrFile && tiled == tiledFile",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x44,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (cVar2 != '\0') {
        lVar4 = Imf_3_2::StdIFStream::tellg();
        if (lVar4 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x46,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      cVar2 = Imf_3_2::isOpenExrFile((IStream *)local_68);
      if ((bool)cVar2 != exrFile) {
        __assert_fail("exr == exrFile",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x49,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (cVar2 != '\0') {
        lVar4 = Imf_3_2::StdIFStream::tellg();
        if (lVar4 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x4b,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      local_69 = (bool)Imf_3_2::isTiledOpenExrFile((IStream *)local_68);
      if (local_69 != tiledFile) {
        __assert_fail("tiled == tiledFile",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                      ,0x4e,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)")
        ;
      }
      if (local_69 != false) {
        lVar4 = Imf_3_2::StdIFStream::tellg();
        if (lVar4 != 0) {
          __assert_fail("is.tellg () == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                        ,0x50,
                        "void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
        }
      }
      Imf_3_2::StdIFStream::~StdIFStream(local_68);
      pcVar5 = "exists";
    }
    else {
      pcVar5 = "does not exist";
    }
    sVar3 = strlen(pcVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    pcVar5 = "is not an OpenEXR file";
    if (exrFile) {
      pcVar5 = "is an OpenEXR file";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar5,(ulong)!exrFile * 4 + 0x12);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    pcVar5 = "is not tiled";
    if (tiledFile) {
      pcVar5 = "is tiled";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar5,(ulong)!tiledFile * 4 + 8);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    return;
  }
  __assert_fail("tiled == tiledFile",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMagic.cpp"
                ,0x3d,"void (anonymous namespace)::testFile2(const char *, bool, bool, bool)");
}

Assistant:

void
testFile2 (const char fileName[], bool exists, bool exrFile, bool tiledFile)
{
    cout << fileName << " " << flush;

    bool exr, tiled;

    exr = isOpenExrFile (fileName, tiled);
    assert (exr == exrFile && tiled == tiledFile);

    exr = isOpenExrFile (fileName);
    assert (exr == exrFile);

    tiled = isTiledOpenExrFile (fileName);
    assert (tiled == tiledFile);

    if (exists)
    {
        StdIFStream is (fileName);

        exr = isOpenExrFile (is, tiled);
        assert (exr == exrFile && tiled == tiledFile);

        if (exr) assert (is.tellg () == 0);

        exr = isOpenExrFile (is);
        assert (exr == exrFile);

        if (exr) assert (is.tellg () == 0);

        tiled = isTiledOpenExrFile (is);
        assert (tiled == tiledFile);

        if (tiled) assert (is.tellg () == 0);
    }

    cout << (exists ? "exists" : "does not exist") << ", "
         << (exrFile ? "is an OpenEXR file" : "is not an OpenEXR file") << ", "
         << (tiledFile ? "is tiled" : "is not tiled") << endl;
}